

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O2

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *pCVar1;
  ChunkHeader *__ptr;
  
  __ptr = this->chunkHead_;
  while ((__ptr != (ChunkHeader *)0x0 && (__ptr != (ChunkHeader *)this->userBuffer_))) {
    pCVar1 = __ptr->next;
    free(__ptr);
    this->chunkHead_ = pCVar1;
    __ptr = pCVar1;
  }
  if (__ptr != (ChunkHeader *)0x0 && __ptr == (ChunkHeader *)this->userBuffer_) {
    __ptr->size = 0;
  }
  return;
}

Assistant:

void Clear() {
        while (chunkHead_ && chunkHead_ != userBuffer_) {
            ChunkHeader* next = chunkHead_->next;
            baseAllocator_->Free(chunkHead_);
            chunkHead_ = next;
        }
        if (chunkHead_ && chunkHead_ == userBuffer_)
            chunkHead_->size = 0; // Clear user buffer
    }